

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadRelocSection(BinaryReader *this,Offset section_size)

{
  RelocType RVar1;
  bool bVar2;
  Result RVar3;
  char *pcVar4;
  RelocType type;
  uint32_t local_54;
  RelocType local_50;
  uint32_t addend;
  uint32_t reloc_type;
  Index index;
  Offset offset;
  Enum local_38;
  Index i;
  uint local_30;
  Enum local_2c;
  Index num_relocs;
  Enum local_24;
  uint32_t section_index;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _section_index = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xac])(this->delegate_,section_size);
  bVar2 = Succeeded((Result)local_24);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_2c = (Enum)ReadU32Leb128(this,&num_relocs,"section index");
    bVar2 = Failed((Result)local_2c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      i = (Index)ReadCount(this,&local_30,"relocation count");
      bVar2 = Failed((Result)i);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        local_38 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xad])
                             (this->delegate_,(ulong)local_30,(ulong)num_relocs);
        bVar2 = Succeeded((Result)local_38);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          for (offset._4_4_ = 0; offset._4_4_ < local_30; offset._4_4_ = offset._4_4_ + 1) {
            local_54 = 0;
            RVar3 = ReadU32Leb128(this,&local_50,"relocation type");
            bVar2 = Failed(RVar3);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar3 = ReadOffset(this,(Offset *)&reloc_type,"offset");
            bVar2 = Failed(RVar3);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar3 = ReadIndex(this,&addend,"index");
            bVar2 = Failed(RVar3);
            RVar1 = local_50;
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (TableIndexI32 < local_50) {
              if (2 < local_50 - MemoryAddressLEB) {
                if (local_50 - TypeIndexLEB < 2) goto LAB_0032ac4b;
                if (1 < local_50 - FunctionOffsetI32) {
                  if (local_50 == EventIndexLEB) goto LAB_0032ac4b;
                  if (local_50 != MemoryAddressRelSLEB) {
                    if (local_50 - TableIndexRelSLEB < 2) goto LAB_0032ac4b;
                    if (3 < local_50 - MemoryAddressLEB64) {
                      if (local_50 - TableIndexSLEB64 < 3) goto LAB_0032ac4b;
                      if (local_50 != MemoryAddressTLSSLEB && local_50 != Last) {
                        pcVar4 = GetRelocTypeName(local_50);
                        PrintError(this,"unknown reloc type: %s",pcVar4);
                        Result::Result((Result *)((long)&this_local + 4),Error);
                        return (Result)this_local._4_4_;
                      }
                    }
                  }
                }
              }
              RVar3 = ReadS32Leb128(this,&local_54,"addend");
              bVar2 = Failed(RVar3);
              if (bVar2) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
LAB_0032ac4b:
            RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xae])
                                    (this->delegate_,(ulong)RVar1,_reloc_type,(ulong)addend,
                                     (ulong)local_54);
            bVar2 = Succeeded(RVar3);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnReloc callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])();
          bVar2 = Succeeded(RVar3);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndRelocSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"OnRelocCount callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
    }
  }
  else {
    PrintError(this,"BeginRelocSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadRelocSection(Offset section_size) {
  CALLBACK(BeginRelocSection, section_size);
  uint32_t section_index;
  CHECK_RESULT(ReadU32Leb128(&section_index, "section index"));
  Index num_relocs;
  CHECK_RESULT(ReadCount(&num_relocs, "relocation count"));
  CALLBACK(OnRelocCount, num_relocs, section_index);
  for (Index i = 0; i < num_relocs; ++i) {
    Offset offset;
    Index index;
    uint32_t reloc_type, addend = 0;
    CHECK_RESULT(ReadU32Leb128(&reloc_type, "relocation type"));
    CHECK_RESULT(ReadOffset(&offset, "offset"));
    CHECK_RESULT(ReadIndex(&index, "index"));
    RelocType type = static_cast<RelocType>(reloc_type);
    switch (type) {
      case RelocType::MemoryAddressLEB:
      case RelocType::MemoryAddressLEB64:
      case RelocType::MemoryAddressSLEB:
      case RelocType::MemoryAddressSLEB64:
      case RelocType::MemoryAddressRelSLEB:
      case RelocType::MemoryAddressRelSLEB64:
      case RelocType::MemoryAddressI32:
      case RelocType::MemoryAddressI64:
      case RelocType::FunctionOffsetI32:
      case RelocType::SectionOffsetI32:
      case RelocType::MemoryAddressTLSSLEB:
      case RelocType::MemoryAddressTLSI32:
        CHECK_RESULT(ReadS32Leb128(&addend, "addend"));
        break;

      case RelocType::FuncIndexLEB:
      case RelocType::TableIndexSLEB:
      case RelocType::TableIndexSLEB64:
      case RelocType::TableIndexI32:
      case RelocType::TableIndexI64:
      case RelocType::TypeIndexLEB:
      case RelocType::GlobalIndexLEB:
      case RelocType::GlobalIndexI32:
      case RelocType::EventIndexLEB:
      case RelocType::TableIndexRelSLEB:
      case RelocType::TableNumberLEB:
        break;

      default:
        PrintError("unknown reloc type: %s", GetRelocTypeName(type));
        return Result::Error;
    }
    CALLBACK(OnReloc, type, offset, index, addend);
  }
  CALLBACK0(EndRelocSection);
  return Result::Ok;
}